

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto3_arena_unittest::TestUnpackedTypes::_InternalSerialize
          (TestUnpackedTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  uint8_t *puVar3;
  RepeatedField<int> *pRVar4;
  const_reference piVar5;
  RepeatedField<long> *pRVar6;
  const_reference plVar7;
  RepeatedField<unsigned_int> *pRVar8;
  const_reference puVar9;
  RepeatedField<unsigned_long> *pRVar10;
  const_reference puVar11;
  RepeatedField<float> *this_00;
  const_reference pfVar12;
  RepeatedField<double> *this_01;
  const_reference pdVar13;
  RepeatedField<bool> *this_02;
  const_reference pbVar14;
  UnknownFieldSet *unknown_fields;
  int local_98;
  int n_13;
  int i_13;
  int n_12;
  int i_12;
  int n_11;
  int i_11;
  int n_10;
  int i_10;
  int n_9;
  int i_9;
  int n_8;
  int i_8;
  int n_7;
  int i_7;
  int n_6;
  int i_6;
  int n_5;
  int i_5;
  int n_4;
  int i_4;
  int n_3;
  int i_3;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32_t cached_has_bits;
  TestUnpackedTypes *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestUnpackedTypes *this_local;
  
  i_1 = 0;
  iVar2 = _internal_repeated_int32_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; i_1 < iVar2; i_1 = i_1 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar4 = _internal_repeated_int32(this);
    piVar5 = google::protobuf::RepeatedField<int>::Get(pRVar4,i_1);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,*piVar5,puVar3);
  }
  i_2 = 0;
  iVar2 = _internal_repeated_int64_size(this);
  for (; i_2 < iVar2; i_2 = i_2 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar6 = _internal_repeated_int64(this);
    plVar7 = google::protobuf::RepeatedField<long>::Get(pRVar6,i_2);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt64ToArray(2,*plVar7,puVar3);
  }
  i_3 = 0;
  iVar2 = _internal_repeated_uint32_size(this);
  for (; i_3 < iVar2; i_3 = i_3 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar8 = _internal_repeated_uint32(this);
    puVar9 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar8,i_3);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3,*puVar9,puVar3);
  }
  i_4 = 0;
  iVar2 = _internal_repeated_uint64_size(this);
  for (; i_4 < iVar2; i_4 = i_4 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar10 = _internal_repeated_uint64(this);
    puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar10,i_4);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(4,*puVar11,puVar3)
    ;
  }
  i_5 = 0;
  iVar2 = _internal_repeated_sint32_size(this);
  for (; i_5 < iVar2; i_5 = i_5 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar4 = _internal_repeated_sint32(this);
    piVar5 = google::protobuf::RepeatedField<int>::Get(pRVar4,i_5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteSInt32ToArray(5,*piVar5,puVar3);
  }
  i_6 = 0;
  iVar2 = _internal_repeated_sint64_size(this);
  for (; i_6 < iVar2; i_6 = i_6 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar6 = _internal_repeated_sint64(this);
    plVar7 = google::protobuf::RepeatedField<long>::Get(pRVar6,i_6);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteSInt64ToArray(6,*plVar7,puVar3);
  }
  i_7 = 0;
  iVar2 = _internal_repeated_fixed32_size(this);
  for (; i_7 < iVar2; i_7 = i_7 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar8 = _internal_repeated_fixed32(this);
    puVar9 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar8,i_7);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFixed32ToArray(7,*puVar9,puVar3)
    ;
  }
  i_8 = 0;
  iVar2 = _internal_repeated_fixed64_size(this);
  for (; i_8 < iVar2; i_8 = i_8 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar10 = _internal_repeated_fixed64(this);
    puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar10,i_8);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFixed64ToArray
                             (8,*puVar11,puVar3);
  }
  i_9 = 0;
  iVar2 = _internal_repeated_sfixed32_size(this);
  for (; i_9 < iVar2; i_9 = i_9 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar4 = _internal_repeated_sfixed32(this);
    piVar5 = google::protobuf::RepeatedField<int>::Get(pRVar4,i_9);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteSFixed32ToArray
                             (9,*piVar5,puVar3);
  }
  i_10 = 0;
  iVar2 = _internal_repeated_sfixed64_size(this);
  for (; i_10 < iVar2; i_10 = i_10 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar6 = _internal_repeated_sfixed64(this);
    plVar7 = google::protobuf::RepeatedField<long>::Get(pRVar6,i_10);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteSFixed64ToArray
                             (10,*plVar7,puVar3);
  }
  i_11 = 0;
  iVar2 = _internal_repeated_float_size(this);
  for (; i_11 < iVar2; i_11 = i_11 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    this_00 = _internal_repeated_float(this);
    pfVar12 = google::protobuf::RepeatedField<float>::Get(this_00,i_11);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFloatToArray
                             (0xb,*pfVar12,puVar3);
  }
  i_12 = 0;
  iVar2 = _internal_repeated_double_size(this);
  for (; i_12 < iVar2; i_12 = i_12 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    this_01 = _internal_repeated_double(this);
    pdVar13 = google::protobuf::RepeatedField<double>::Get(this_01,i_12);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray
                             (0xc,*pdVar13,puVar3);
  }
  i_13 = 0;
  iVar2 = _internal_repeated_bool_size(this);
  for (; i_13 < iVar2; i_13 = i_13 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    this_02 = _internal_repeated_bool(this);
    pbVar14 = google::protobuf::RepeatedField<bool>::Get(this_02,i_13);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteBoolToArray
                             (0xd,(bool)(*pbVar14 & 1),puVar3);
  }
  local_98 = 0;
  iVar2 = _internal_repeated_nested_enum_size(this);
  for (; local_98 < iVar2; local_98 = local_98 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar4 = _internal_repeated_nested_enum(this);
    piVar5 = google::protobuf::RepeatedField<int>::Get(pRVar4,local_98);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(0xe,*piVar5,puVar3);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestUnpackedTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestUnpackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_arena_unittest.TestUnpackedTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 1 [packed = false];
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1, this_._internal_repeated_int32().Get(i), target);
  }

  // repeated int64 repeated_int64 = 2 [packed = false];
  for (int i = 0, n = this_._internal_repeated_int64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt64ToArray(
        2, this_._internal_repeated_int64().Get(i), target);
  }

  // repeated uint32 repeated_uint32 = 3 [packed = false];
  for (int i = 0, n = this_._internal_repeated_uint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        3, this_._internal_repeated_uint32().Get(i), target);
  }

  // repeated uint64 repeated_uint64 = 4 [packed = false];
  for (int i = 0, n = this_._internal_repeated_uint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        4, this_._internal_repeated_uint64().Get(i), target);
  }

  // repeated sint32 repeated_sint32 = 5 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt32ToArray(
        5, this_._internal_repeated_sint32().Get(i), target);
  }

  // repeated sint64 repeated_sint64 = 6 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt64ToArray(
        6, this_._internal_repeated_sint64().Get(i), target);
  }

  // repeated fixed32 repeated_fixed32 = 7 [packed = false];
  for (int i = 0, n = this_._internal_repeated_fixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        7, this_._internal_repeated_fixed32().Get(i), target);
  }

  // repeated fixed64 repeated_fixed64 = 8 [packed = false];
  for (int i = 0, n = this_._internal_repeated_fixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed64ToArray(
        8, this_._internal_repeated_fixed64().Get(i), target);
  }

  // repeated sfixed32 repeated_sfixed32 = 9 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sfixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed32ToArray(
        9, this_._internal_repeated_sfixed32().Get(i), target);
  }

  // repeated sfixed64 repeated_sfixed64 = 10 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sfixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed64ToArray(
        10, this_._internal_repeated_sfixed64().Get(i), target);
  }

  // repeated float repeated_float = 11 [packed = false];
  for (int i = 0, n = this_._internal_repeated_float_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        11, this_._internal_repeated_float().Get(i), target);
  }

  // repeated double repeated_double = 12 [packed = false];
  for (int i = 0, n = this_._internal_repeated_double_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        12, this_._internal_repeated_double().Get(i), target);
  }

  // repeated bool repeated_bool = 13 [packed = false];
  for (int i = 0, n = this_._internal_repeated_bool_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        13, this_._internal_repeated_bool().Get(i), target);
  }

  // repeated .proto3_arena_unittest.TestAllTypes.NestedEnum repeated_nested_enum = 14 [packed = false];
  for (int i = 0, n = this_._internal_repeated_nested_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        14, static_cast<::proto3_arena_unittest::TestAllTypes_NestedEnum>(this_._internal_repeated_nested_enum().Get(i)),
        target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_arena_unittest.TestUnpackedTypes)
  return target;
}